

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

LatticePathWithScore * __thiscall sentencepiece::unigram::Lattice::Viterbi(Lattice *this)

{
  bool bVar1;
  int iVar2;
  reference ppNVar3;
  char *pcVar4;
  ostream *poVar5;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *pvVar6;
  reference this_00;
  reference ppNVar7;
  long in_RSI;
  LatticePathWithScore *in_RDI;
  Node *node;
  float score;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  results;
  float score_1;
  Node *lnode;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  Node *best_node;
  float best_score;
  Node *rnode;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int pos;
  int len;
  LatticePathWithScore *retval;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  *in_stack_fffffffffffffed8;
  Lattice *in_stack_fffffffffffffee0;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  in_stack_fffffffffffffee8;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  in_stack_fffffffffffffef0;
  Node *local_a8;
  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
  local_98;
  byte local_6e;
  Die local_6d;
  float local_6c;
  Node *local_68;
  Node **local_60;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_58;
  reference local_50;
  Node *local_48;
  float local_3c;
  Node *local_38;
  Node **local_30;
  __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
  local_28;
  reference local_20;
  int local_18;
  int local_14;
  
  local_14 = size(in_stack_fffffffffffffee0);
  local_18 = 0;
  do {
    if (local_14 < local_18) {
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::vector((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                *)0x47e766);
      pvVar6 = begin_nodes(in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20)
                          );
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::operator[](pvVar6,0);
      this_00 = std::
                vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                              *)(in_RSI + 0x30),(long)local_14);
      ppNVar7 = std::
                vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                ::operator[](this_00,0);
      for (local_a8 = (*ppNVar7)->prev; local_a8->prev != (Node *)0x0; local_a8 = local_a8->prev) {
        std::
        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
        ::push_back((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                     *)in_stack_fffffffffffffef0._M_current,in_stack_fffffffffffffee8._M_current);
      }
      pvVar6 = &local_98;
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::begin(pvVar6);
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::end(pvVar6);
      std::
      reverse<__gnu_cxx::__normal_iterator<sentencepiece::unigram::Lattice::Node**,std::vector<sentencepiece::unigram::Lattice::Node*,std::allocator<sentencepiece::unigram::Lattice::Node*>>>>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      std::
      pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
      ::
      pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_&,_float_&,_true>
                ((pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
                  *)in_stack_fffffffffffffef0._M_current,
                 (vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  *)in_stack_fffffffffffffee8._M_current,(float *)in_stack_fffffffffffffee0);
      std::
      vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
      ::~vector((vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                 *)in_stack_fffffffffffffef0._M_current);
      return in_RDI;
    }
    local_20 = std::
               vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
               ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                             *)(in_RSI + 0x30),(long)local_18);
    local_28._M_current =
         (Node **)std::
                  vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                  ::begin(in_stack_fffffffffffffed8);
    local_30 = (Node **)std::
                        vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                        ::end(in_stack_fffffffffffffed8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                               *)in_stack_fffffffffffffee0,
                              (__normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                               *)in_stack_fffffffffffffed8), bVar1) {
      ppNVar3 = __gnu_cxx::
                __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                ::operator*(&local_28);
      local_38 = *ppNVar3;
      local_38->prev = (Node *)0x0;
      local_3c = 0.0;
      local_48 = (Node *)0x0;
      local_50 = std::
                 vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                 ::operator[]((vector<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_std::allocator<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>_>
                               *)(in_RSI + 0x48),(long)local_18);
      local_58._M_current =
           (Node **)std::
                    vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                    ::begin(in_stack_fffffffffffffed8);
      local_60 = (Node **)std::
                          vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>
                          ::end(in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                 *)in_stack_fffffffffffffee0,
                                (__normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                                 *)in_stack_fffffffffffffed8), bVar1) {
        ppNVar3 = __gnu_cxx::
                  __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
                  ::operator*(&local_58);
        local_68 = *ppNVar3;
        local_6c = local_68->backtrace_score + local_38->score;
        if ((local_48 == (Node *)0x0) || (local_3c < local_6c)) {
          local_48 = local_68;
          local_3c = local_6c;
        }
        __gnu_cxx::
        __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
        ::operator++(&local_58);
      }
      if (local_48 == (Node *)0x0) {
        iVar2 = logging::GetMinLogLevel();
        local_6e = 0;
        if (iVar2 < 3) {
          error::Die::Die(&local_6d,false);
          local_6e = 1;
          pcVar4 = logging::BaseName((char *)in_stack_fffffffffffffed8);
          poVar5 = std::operator<<((ostream *)&std::cerr,pcVar4);
          poVar5 = std::operator<<(poVar5,"(");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xb1);
          poVar5 = std::operator<<(poVar5,") ");
          poVar5 = std::operator<<(poVar5,"LOG(");
          poVar5 = std::operator<<(poVar5,"ERROR");
          poVar5 = std::operator<<(poVar5,") ");
          in_stack_fffffffffffffee0 =
               (Lattice *)std::operator<<(poVar5,"Failed to find the best path in Viterbi.");
          error::Die::operator&(&local_6d,(ostream *)in_stack_fffffffffffffee0);
        }
        if ((local_6e & 1) != 0) {
          error::Die::~Die((Die *)in_stack_fffffffffffffee0);
        }
        std::
        pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
        ::
        pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float,_true>
                  ((pair<std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>,_float>
                    *)in_stack_fffffffffffffee0);
        return in_RDI;
      }
      local_38->prev = local_48;
      local_38->backtrace_score = local_3c;
      __gnu_cxx::
      __normal_iterator<sentencepiece::unigram::Lattice::Node_**,_std::vector<sentencepiece::unigram::Lattice::Node_*,_std::allocator<sentencepiece::unigram::Lattice::Node_*>_>_>
      ::operator++(&local_28);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

Lattice::LatticePathWithScore Lattice::Viterbi() {
  const int len = size();

  for (int pos = 0; pos <= len; ++pos) {
    for (Node *rnode : begin_nodes_[pos]) {
      rnode->prev = nullptr;
      float best_score = 0.0;
      Node *best_node = nullptr;
      for (Node *lnode : end_nodes_[pos]) {
        const float score = lnode->backtrace_score + rnode->score;
        if (best_node == nullptr || score > best_score) {
          best_node = lnode;
          best_score = score;
        }
      }
      if (best_node == nullptr) {
        LOG(ERROR) << "Failed to find the best path in Viterbi.";
        return {};
      }
      rnode->prev = best_node;
      rnode->backtrace_score = best_score;
    }
  }

  // backtrace
  std::vector<Node *> results;
  float score = begin_nodes(len)[0]->backtrace_score;
  for (Node *node = begin_nodes_[len][0]->prev; node->prev != nullptr;
       node = node->prev) {
    results.push_back(node);
  }

  std::reverse(results.begin(), results.end());

  LatticePathWithScore retval = {results, score};

  return retval;
}